

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save-charoutput.c
# Opt level: O0

_Bool save_charoutput(void)

{
  _Bool _Var1;
  char *src;
  ang_file *f;
  level_conflict *lev;
  char depths [80];
  _Bool written;
  ang_file *fo;
  char path [1024];
  
  depths[0x4f] = '\x01';
  src = locality_name(world->levels[player->place].locality);
  my_strcpy((char *)&lev,src,0x50);
  path_build((char *)&fo,0x400,ANGBAND_DIR_USER,"CharOutput.txt");
  f = file_open((char *)&fo,MODE_WRITE,FTYPE_TEXT);
  if (f == (ang_file *)0x0) {
    depths[0x4f] = '\0';
  }
  else {
    _Var1 = file_put(f,"{\n");
    if (!_Var1) {
      depths[0x4f] = '\0';
    }
    _Var1 = file_putf(f,"race: \"%s\",\n",player->race->name);
    if (!_Var1) {
      depths[0x4f] = '\0';
    }
    _Var1 = file_putf(f,"class: \"%s\",\n",player->class->name);
    if (!_Var1) {
      depths[0x4f] = '\0';
    }
    _Var1 = file_putf(f,"mapName: \"%s\",\n",&lev);
    if (!_Var1) {
      depths[0x4f] = '\0';
    }
    _Var1 = file_putf(f,"dLvl: \"%i\",\n",(ulong)(uint)(int)player->depth);
    if (!_Var1) {
      depths[0x4f] = '\0';
    }
    _Var1 = file_putf(f,"cLvl: \"%i\",\n",(ulong)(uint)(int)player->lev);
    if (!_Var1) {
      depths[0x4f] = '\0';
    }
    _Var1 = file_putf(f,"isDead: \"%i\",\n",(ulong)((player->is_dead & 1U) != 0));
    if (!_Var1) {
      depths[0x4f] = '\0';
    }
    _Var1 = file_putf(f,"killedBy: \"%s\"\n",player->died_from);
    if (!_Var1) {
      depths[0x4f] = '\0';
    }
    _Var1 = file_put(f,"}");
    if (!_Var1) {
      depths[0x4f] = '\0';
    }
    _Var1 = file_close(f);
    if (!_Var1) {
      depths[0x4f] = '\0';
    }
  }
  return (_Bool)(depths[0x4f] & 1);
}

Assistant:

bool save_charoutput(void)
{
	char path[1024];
	ang_file *fo;
	bool written = true;
	char depths[80];
	struct level *lev = &world->levels[player->place];

	my_strcpy(depths, locality_name(lev->locality), sizeof(depths));

	path_build(path, sizeof(path), ANGBAND_DIR_USER, "CharOutput.txt");
	fo = file_open(path, MODE_WRITE, FTYPE_TEXT);
	if (fo) {
		if (! file_put(fo, "{\n")) written = false;
		if (! file_putf(fo, "race: \"%s\",\n", player->race->name)) written = false;
		if (! file_putf(fo, "class: \"%s\",\n", player->class->name)) written = false;
		if (! file_putf(fo, "mapName: \"%s\",\n", depths)) written = false;
		if (! file_putf(fo, "dLvl: \"%i\",\n", player->depth)) written = false;
		if (! file_putf(fo, "cLvl: \"%i\",\n", player->lev)) written = false;
		if (! file_putf(fo, "isDead: \"%i\",\n", (player->is_dead) ? 1 : 0)) written = false;
		if (! file_putf(fo, "killedBy: \"%s\"\n", player->died_from)) written = false;
		if (! file_put(fo, "}")) written = false;
		if (! file_close(fo)) written = false;
	} else {
		written = false;
	}
	return written;
}